

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O2

Index __thiscall wasm::DataFlow::Users::getNumUses(Users *this,Node *node)

{
  UserSet *pUVar1;
  __node_base *p_Var2;
  Index IVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  bool bVar6;
  
  pUVar1 = getUsers(this,node);
  p_Var2 = &(pUVar1->_M_h)._M_before_begin;
  IVar3 = 0;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return IVar3;
    }
    bVar5 = false;
    for (p_Var4 = p_Var2[1]._M_nxt[3]._M_nxt; p_Var4 != p_Var2[1]._M_nxt[4]._M_nxt;
        p_Var4 = p_Var4 + 1) {
      bVar6 = (Node *)p_Var4->_M_nxt == node;
      bVar5 = (bool)(bVar5 | bVar6);
      IVar3 = IVar3 + bVar6;
    }
  } while (bVar5);
  __assert_fail("found",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/users.h"
                ,0x4b,"Index wasm::DataFlow::Users::getNumUses(Node *)");
}

Assistant:

Index getNumUses(Node* node) {
    auto& users = getUsers(node);
    // A user may have more than one use
    Index numUses = 0;
    for (auto* user : users) {
#ifndef NDEBUG
      bool found = false;
#endif
      for (auto* value : user->values) {
        if (value == node) {
          numUses++;
#ifndef NDEBUG
          found = true;
#endif
        }
      }
      assert(found);
    }
    return numUses;
  }